

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::InsertCompileOption
          (cmTarget *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *entry,bool before)

{
  pointer pcVar1;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_50;
  byte local_19;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBStack_18;
  bool before_local;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *entry_local;
  cmTarget *this_local;
  
  local_19 = before;
  pBStack_18 = entry;
  entry_local = (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)this;
  pcVar1 = std::unique_ptr<cmTargetInternals,_std::default_delete<cmTargetInternals>_>::operator->
                     (&this->impl);
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::BT
            (&local_50,pBStack_18);
  anon_unknown.dwarf_6625f0::UsageRequirementProperty::WriteDirect
            (&pcVar1->CompileOptions,&local_50,Append - (local_19 & 1));
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::~BT
            (&local_50);
  return;
}

Assistant:

void cmTarget::InsertCompileOption(BT<std::string> const& entry, bool before)
{
  this->impl->CompileOptions.WriteDirect(
    entry,
    before ? UsageRequirementProperty::Action::Prepend
           : UsageRequirementProperty::Action::Append);
}